

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

char * testing::internal::ParseFlagValue(char *str,char *flag,bool def_optional)

{
  int iVar1;
  char *pcVar2;
  String flag_str;
  char *local_38;
  size_t local_30;
  
  if (flag == (char *)0x0 || str == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = (char *)0x0;
    String::Format((char *)&local_38,"--%s%s","gtest_");
    iVar1 = strncmp(str,local_38,local_30);
    if (iVar1 == 0) {
      pcVar2 = str + local_30;
      if (((!def_optional) || (str[local_30] != '\0')) &&
         (pcVar2 = pcVar2 + 1, str[local_30] != '=')) {
        pcVar2 = (char *)0x0;
      }
    }
    if (local_38 != (char *)0x0) {
      operator_delete__(local_38);
    }
  }
  return pcVar2;
}

Assistant:

const char* ParseFlagValue(const char* str,
                           const char* flag,
                           bool def_optional) {
  // str and flag must not be NULL.
  if (str == NULL || flag == NULL) return NULL;

  // The flag must start with "--" followed by GTEST_FLAG_PREFIX_.
  const String flag_str = String::Format("--%s%s", GTEST_FLAG_PREFIX_, flag);
  const size_t flag_len = flag_str.length();
  if (strncmp(str, flag_str.c_str(), flag_len) != 0) return NULL;

  // Skips the flag name.
  const char* flag_end = str + flag_len;

  // When def_optional is true, it's OK to not have a "=value" part.
  if (def_optional && (flag_end[0] == '\0')) {
    return flag_end;
  }

  // If def_optional is true and there are more characters after the
  // flag name, or if def_optional is false, there must be a '=' after
  // the flag name.
  if (flag_end[0] != '=') return NULL;

  // Returns the string after "=".
  return flag_end + 1;
}